

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

bool __thiscall wabt::WastParser::ParseElemExprOpt(WastParser *this,ExprList *out_elem_expr)

{
  Expr *pEVar1;
  Expr *pEVar2;
  _func_int ***ppp_Var3;
  bool bVar4;
  Result RVar5;
  TokenType TVar6;
  TokenType token_type;
  ExprList exprs;
  ExprList local_48;
  
  bVar4 = MatchLpar(this,Item);
  local_48.first_ = (Expr *)0x0;
  local_48.last_ = (Expr *)0x0;
  local_48.size_ = 0;
  if (bVar4) {
    RVar5 = ParseTerminatingInstrList(this,&local_48);
    if (RVar5.enum_ == Ok) {
      RVar5 = Expect(this,Rpar);
      bVar4 = true;
      pEVar1 = local_48.first_;
      if (RVar5.enum_ == Error) goto joined_r0x00138def;
LAB_00138d90:
      if (local_48.size_ != 0) {
        pEVar1 = out_elem_expr->first_;
        while (pEVar1 != (Expr *)0x0) {
          ppp_Var3 = &pEVar1->_vptr_Expr;
          pEVar1 = (pEVar1->super_intrusive_list_base<wabt::Expr>).next_;
          (*(*ppp_Var3)[1])();
        }
        out_elem_expr->first_ = (Expr *)0x0;
        out_elem_expr->last_ = (Expr *)0x0;
        out_elem_expr->size_ = 0;
        out_elem_expr->first_ = local_48.first_;
        out_elem_expr->last_ = local_48.last_;
        out_elem_expr->size_ = local_48.size_;
        local_48.size_ = 0;
        local_48.first_ = (Expr *)0x0;
        local_48.last_ = (Expr *)0x0;
        bVar4 = true;
        pEVar1 = local_48.first_;
        goto joined_r0x00138def;
      }
    }
  }
  else {
    bVar4 = false;
    TVar6 = Peek(this,0);
    token_type = Peek(this,1);
    pEVar1 = local_48.first_;
    if (TVar6 != Lpar) goto joined_r0x00138def;
    bVar4 = anon_unknown_1::IsPlainInstr(token_type);
    if (!bVar4) {
      bVar4 = false;
      pEVar1 = local_48.first_;
      if ((0x3c < token_type - Block) ||
         ((0x1800000008400001U >> ((ulong)(token_type - Block) & 0x3f) & 1) == 0))
      goto joined_r0x00138def;
    }
    RVar5 = ParseExpr(this,&local_48);
    if (RVar5.enum_ == Ok) goto LAB_00138d90;
  }
  bVar4 = false;
  pEVar1 = local_48.first_;
joined_r0x00138def:
  while (pEVar1 != (Expr *)0x0) {
    pEVar2 = (pEVar1->super_intrusive_list_base<wabt::Expr>).next_;
    (*pEVar1->_vptr_Expr[1])();
    pEVar1 = pEVar2;
  }
  return bVar4;
}

Assistant:

bool WastParser::ParseElemExprOpt(ExprList* out_elem_expr) {
  WABT_TRACE(ParseElemExprOpt);
  bool item = MatchLpar(TokenType::Item);
  ExprList exprs;
  if (item) {
    if (ParseTerminatingInstrList(&exprs) != Result::Ok) {
      return false;
    }
    EXPECT(Rpar);
  } else {
    if (!IsExpr(PeekPair()) || ParseExpr(&exprs) != Result::Ok) {
      return false;
    }
  }
  if (!exprs.size()) {
    return false;
  }
  *out_elem_expr = std::move(exprs);
  return true;
}